

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

cf_bool_t cf_array_erase(cf_array_t *self,int index)

{
  cf_size_t dst_size;
  cf_bool_t cVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  cVar1 = 0;
  if (-2 < index) {
    uVar4 = (ulong)index;
    cVar1 = 0;
    if (uVar4 < self->elm_count) {
      uVar2 = self->elm_count - 1;
      if (uVar4 < uVar2) {
        do {
          dst_size = self->elm_size;
          lVar3 = dst_size * uVar4;
          uVar4 = uVar4 + 1;
          cf_memcpy_s((cf_void_t *)(lVar3 + (long)self->elm_start),dst_size,
                      (cf_void_t *)(dst_size * uVar4 + (long)self->elm_start),dst_size);
          uVar2 = self->elm_count - 1;
        } while (uVar4 < uVar2);
      }
      self->elm_count = uVar2;
      cVar1 = 1;
    }
  }
  return cVar1;
}

Assistant:

cf_bool_t cf_array_erase(cf_array_t* self, int index) {
    cf_size_t i;
    if (index < CF_ARRAY_END_INDEX || (cf_size_t)index >= self->elm_count || self->elm_count <= 0) {
        return CF_FALSE;
    }
    if (index == CF_ARRAY_END_INDEX) {
        self->elm_count -= 1;
        return CF_TRUE;
    }
    for (i = index; i < self->elm_count - 1; i++) {
        cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * i,
            self->elm_size,
            (cf_uint8_t*)self->elm_start + self->elm_size * (i + 1),
            self->elm_size);
    }
    self->elm_count -= 1;
    return CF_TRUE;
}